

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O2

int __thiscall
pstore::sstring_view<std::shared_ptr<const_char>_>::compare<char[1]>
          (sstring_view<std::shared_ptr<const_char>_> *this,char (*s) [1])

{
  uint uVar1;
  size_t sVar2;
  ulong __n;
  
  sVar2 = strlen(*s);
  __n = this->size_;
  if (sVar2 < this->size_) {
    __n = sVar2;
  }
  uVar1 = __gnu_cxx::char_traits<const_char>::compare
                    ((this->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     *s,__n);
  if (uVar1 == 0) {
    uVar1 = 0;
    if (this->size_ != sVar2) {
      uVar1 = -(uint)(this->size_ < sVar2) | 1;
    }
  }
  return uVar1;
}

Assistant:

int sstring_view<PointerType>::compare (StringType const & s) const {
        auto const slen = string_traits<StringType>::length (s);
        size_type const common_len = std::min (size (), slen);
        int result = traits::compare (data (), string_traits<StringType>::data (s), common_len);
        if (result == 0) {
            result = (size () == slen) ? 0 : (size () < slen ? -1 : 1);
        }
        return result;
    }